

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NavierStokesBase.cpp
# Opt level: O2

Real __thiscall NavierStokesBase::initialTimeStep(NavierStokesBase *this)

{
  Real RVar1;
  ostream *os_;
  double extraout_XMM0_Qa;
  Print local_190;
  
  RVar1 = init_shrink;
  (*(this->super_AmrLevel)._vptr_AmrLevel[0x31])();
  os_ = amrex::OutStream();
  amrex::Print::Print(&local_190,os_);
  std::operator<<((ostream *)&local_190.ss,"Multiplying dt by init_shrink: dt = ");
  std::ostream::_M_insert<double>(RVar1 * extraout_XMM0_Qa);
  std::operator<<((ostream *)&local_190.ss,'\n');
  amrex::Print::~Print(&local_190);
  return RVar1 * extraout_XMM0_Qa;
}

Assistant:

Real
NavierStokesBase::initialTimeStep ()
{
    Real returnDt = init_shrink*estTimeStep();

    amrex::Print() << "Multiplying dt by init_shrink: dt = "
                   << returnDt << '\n';
    return returnDt;
}